

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# talg.c
# Opt level: O0

void psiweight(double *phi,double *theta,double *psi,int p,int q,int j)

{
  undefined8 *__ptr;
  double *th;
  double temp;
  int local_30;
  int k;
  int i;
  int j_local;
  int q_local;
  int p_local;
  double *psi_local;
  double *theta_local;
  double *phi_local;
  
  *psi = 1.0;
  __ptr = (undefined8 *)malloc((long)(q + 1) << 3);
  *__ptr = 0x3ff0000000000000;
  for (local_30 = 0; local_30 < q; local_30 = local_30 + 1) {
    __ptr[local_30 + 1] = theta[local_30];
  }
  for (local_30 = 1; local_30 < j; local_30 = local_30 + 1) {
    psi[local_30] = 0.0;
    th = (double *)0x0;
    if (local_30 <= q) {
      psi[local_30] = (double)__ptr[local_30];
    }
    for (temp._4_4_ = 1; temp._4_4_ < p + 1; temp._4_4_ = temp._4_4_ + 1) {
      if (-1 < local_30 - temp._4_4_) {
        th = (double *)(phi[temp._4_4_ + -1] * psi[local_30 - temp._4_4_] + (double)th);
      }
    }
    psi[local_30] = (double)th + psi[local_30];
  }
  free(__ptr);
  return;
}

Assistant:

void psiweight(double *phi,double *theta,double *psi,int p,int q,int j) {
	int i,k;
	double temp;
	double *th;
	psi[0] = 1.0;
	th = (double*) malloc(sizeof(double) * (q+1));	
	th[0] = 1.;
	for(i = 0; i < q;++i) {
		th[i+1] = theta[i];
	}
	
	for(i = 1; i < j;++i) {
		psi[i] = 0.0;
		temp = 0.0;
		if(i <= q) {
			psi[i] = th[i];
		}
		for(k = 1; k < p+1;++k) {
			if((i - k) >= 0) {
				temp+=phi[k-1] * psi[i-k];
			} 
			
		}
		psi[i] += temp;
	}
	
	free(th);
}